

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs_file_base.cpp
# Opt level: O2

void __thiscall foxxll::ufs_file_base::lock(ufs_file_base *this)

{
  int iVar1;
  ostream *poVar2;
  int *piVar3;
  char *pcVar4;
  io_error *this_00;
  unique_lock<std::mutex> fd_lock;
  string local_1c8;
  ushort local_1a8;
  undefined2 local_1a6;
  undefined8 local_1a0;
  undefined8 uStack_198;
  ostringstream msg;
  
  std::unique_lock<std::mutex>::unique_lock(&fd_lock,&this->fd_mutex_);
  local_1a8 = ~(ushort)this->mode_ & 1;
  local_1a6 = 0;
  local_1a0 = 0;
  uStack_198 = 0;
  iVar1 = fcntl64(this->file_des_,6);
  if (-1 < iVar1) {
    std::unique_lock<std::mutex>::~unique_lock(&fd_lock);
    return;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&msg);
  poVar2 = std::operator<<((ostream *)&msg,"Error in ");
  poVar2 = std::operator<<(poVar2,"virtual void foxxll::ufs_file_base::lock()");
  poVar2 = std::operator<<(poVar2," : ");
  poVar2 = std::operator<<(poVar2,"fcntl(,F_SETLK,) path=");
  poVar2 = std::operator<<(poVar2,(string *)&this->filename_);
  poVar2 = std::operator<<(poVar2," fd=");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,this->file_des_);
  poVar2 = std::operator<<(poVar2," : ");
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  std::operator<<(poVar2,pcVar4);
  this_00 = (io_error *)__cxa_allocate_exception(0x20);
  std::__cxx11::stringbuf::str();
  io_error::io_error(this_00,&local_1c8);
  __cxa_throw(this_00,&io_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
}

Assistant:

void ufs_file_base::lock()
{
#if FOXXLL_WINDOWS || defined(__MINGW32__)
    // not yet implemented
#else
    std::unique_lock<std::mutex> fd_lock(fd_mutex_);
    struct flock lock_struct;
    lock_struct.l_type = static_cast<short>(mode_ & RDONLY ? F_RDLCK : F_RDLCK | F_WRLCK);
    lock_struct.l_whence = SEEK_SET;
    lock_struct.l_start = 0;
    lock_struct.l_len = 0; // lock all bytes
    if ((::fcntl(file_des_, F_SETLK, &lock_struct)) < 0)
        FOXXLL_THROW_ERRNO(io_error, "fcntl(,F_SETLK,) path=" << filename_ << " fd=" << file_des_);
#endif
}